

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall nivalis::ParseSession::begin_thunk(ParseSession *this)

{
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  pointer *__x;
  undefined4 in_stack_ffffffffffffffe8;
  
  __x = &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  this_00 = (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       (in_RDI + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_RDI,(value_type_conflict1 *)__x);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
  emplace_back<nivalis::OpCode::_OpCode>(this_00,(_OpCode *)CONCAT44(8,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void begin_thunk() {
        thunks.push_back(result.ast.size());
        result.ast.emplace_back(OpCode::thunk_ret);
    }